

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  ostream *this;
  int **ppiVar2;
  Vec<unsigned_char,_3> *this_00;
  byte *pbVar3;
  long lVar4;
  undefined8 in_stack_fffffffffffff028;
  undefined4 uVar5;
  _InputArray local_f40;
  allocator<char> local_f21;
  string local_f20 [32];
  MatSize local_f00 [8];
  _OutputArray local_ef8;
  _InputArray local_ee0;
  vector<int,_std::allocator<int>_> local_ec8;
  _InputArray local_ea8;
  allocator<char> local_e89;
  string local_e88 [32];
  uchar *local_e68;
  uchar *data_a;
  uchar *data_b;
  uchar *data_s;
  _OutputArray local_e48;
  _InputArray local_e30;
  int local_e18;
  int local_e14;
  int j;
  int i;
  int src_col;
  int src_row;
  pointer piStack_e00;
  pointer local_df8;
  _InputArray local_de8;
  allocator<char> local_dc9;
  string local_dc8 [32];
  Point_<int> local_da8;
  Size_<int> local_da0;
  _OutputArray local_d98;
  _InputArray local_d80;
  allocator<char> local_d61;
  string local_d60 [32];
  string local_d40 [8];
  Mat alp;
  allocator<char> local_cd9;
  string local_cd8 [32];
  string local_cb8 [8];
  Mat b_k;
  int **alpha;
  SharedMatting sm;
  _InputArray local_a88;
  allocator<char> local_a69;
  string local_a68 [32];
  _OutputArray local_a48;
  _InputArray local_a30;
  _InputArray local_a18;
  undefined1 local_a00 [32];
  Point_<int> local_9e0;
  _InputArray local_9d8;
  _OutputArray local_9c0;
  _InputArray local_9a8;
  undefined1 local_990 [32];
  Point_<int> local_970;
  _InputArray local_968;
  _OutputArray local_950;
  _InputArray local_938;
  undefined1 local_920 [32];
  Point_<int> local_900;
  _InputArray local_8f8;
  _OutputArray local_8e0;
  _InputArray local_8c8;
  undefined1 local_8b0 [32];
  Point_<int> local_890;
  _InputArray local_888;
  _OutputArray local_870;
  _InputArray local_858;
  undefined1 local_840 [32];
  Point_<int> local_820;
  _InputArray local_818;
  _OutputArray local_800;
  _InputArray local_7e8;
  undefined1 local_7d0 [32];
  Point_<int> local_7b0;
  _InputArray local_7a8;
  _OutputArray local_790;
  _InputArray local_778;
  undefined1 local_760 [32];
  Point_<int> local_740;
  _InputArray local_738;
  _OutputArray local_720;
  _InputArray local_708;
  undefined1 local_6f0 [32];
  Point_<int> local_6d0;
  _InputArray local_6c8;
  _OutputArray local_6b0;
  _InputArray local_698;
  undefined1 local_680 [32];
  Point_<int> local_660;
  _InputArray local_658;
  _OutputArray local_640;
  _InputArray local_628;
  undefined1 local_610 [32];
  Point_<int> local_5f0;
  _InputArray local_5e8;
  _OutputArray local_5d0;
  _InputArray local_5b8;
  Point_<int> local_5a0;
  Size_<int> local_598;
  Mat local_590 [8];
  Mat element_e;
  Point_<int> local_530;
  Size_<int> local_528;
  Mat local_520 [8];
  Mat element;
  _OutputArray local_4c0;
  _InputArray local_4a8;
  _InputArray local_490;
  _OutputArray local_478;
  _InputArray local_460;
  Scalar_<double> local_448;
  Scalar_<double> local_428;
  Scalar_<double> local_408;
  Point_<int> local_3e8;
  _InputOutputArray local_3e0;
  undefined1 local_3c8 [8];
  Rect ccomp;
  _InputArray local_3a0;
  Point_<int> local_388;
  Size_<int> local_380;
  _OutputArray local_378;
  _InputArray local_360;
  Mat local_348 [8];
  Mat trimap;
  Mat local_2e8 [8];
  Mat dil;
  Mat local_288 [8];
  Mat ero;
  Mat local_228 [8];
  Mat can;
  Mat local_1c8 [8];
  Mat can2;
  Mat local_168 [8];
  Mat can1;
  Mat local_108 [8];
  Mat out;
  allocator<char> local_91;
  string local_90 [32];
  string local_70 [8];
  Mat src;
  int local_64;
  
  uVar5 = (undefined4)((ulong)in_stack_fffffffffffff028 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_90,"input/lady1.jpg",&local_91);
  cv::imread(local_70,(int)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  cv::Mat::Mat(local_108);
  cv::Mat::Mat(local_168);
  cv::Mat::Mat(local_1c8);
  cv::Mat::Mat(local_228);
  cv::Mat::Mat(local_288);
  cv::Mat::Mat(local_2e8);
  cv::Mat::Mat(local_348);
  cv::_InputArray::_InputArray(&local_360,(Mat *)local_70);
  cv::_OutputArray::_OutputArray(&local_378,local_108);
  cv::Size_<int>::Size_(&local_380,10,10);
  cv::Point_<int>::Point_(&local_388,-1,-1);
  cv::boxFilter(&local_360,&local_378,0xffffffff,&local_380,&local_388,1,CONCAT44(uVar5,4));
  cv::_OutputArray::~_OutputArray(&local_378);
  cv::_InputArray::~_InputArray(&local_360);
  cv::_InputArray::_InputArray(&local_3a0,local_108);
  cv::_OutputArray::_OutputArray((_OutputArray *)&ccomp.width,local_168);
  cv::Canny(&local_3a0,(_OutputArray *)&ccomp.width,36.0,36.0,3,false);
  cv::_OutputArray::~_OutputArray((_OutputArray *)&ccomp.width);
  cv::_InputArray::~_InputArray(&local_3a0);
  cv::Rect_<int>::Rect_((Rect_<int> *)local_3c8);
  cv::_InputOutputArray::_InputOutputArray(&local_3e0,local_108);
  cv::Point_<int>::Point_(&local_3e8,10,10);
  cv::Scalar_<double>::Scalar_(&local_408,0.0,0.0,0.0,0.0);
  cv::Scalar_<double>::Scalar_(&local_428,3.0,3.0,3.0,0.0);
  cv::Scalar_<double>::Scalar_(&local_448,3.0,3.0,3.0,0.0);
  cv::floodFill(&local_3e0,&local_3e8,&local_408,local_3c8,&local_428,&local_448,4);
  cv::_InputOutputArray::~_InputOutputArray(&local_3e0);
  cv::_InputArray::_InputArray(&local_460,local_108);
  cv::_OutputArray::_OutputArray(&local_478,local_1c8);
  cv::Canny(&local_460,&local_478,15.0,15.0,3,false);
  cv::_OutputArray::~_OutputArray(&local_478);
  cv::_InputArray::~_InputArray(&local_460);
  cv::_InputArray::_InputArray(&local_490,local_168);
  cv::_InputArray::_InputArray(&local_4a8,local_1c8);
  cv::_OutputArray::_OutputArray(&local_4c0,local_228);
  cv::addWeighted(&local_490,1.0,&local_4a8,1.0,0.0,&local_4c0,-1);
  cv::_OutputArray::~_OutputArray(&local_4c0);
  cv::_InputArray::~_InputArray(&local_4a8);
  cv::_InputArray::~_InputArray(&local_490);
  cv::Size_<int>::Size_(&local_528,0x23,0x23);
  cv::Point_<int>::Point_(&local_530,-1,-1);
  cv::getStructuringElement(local_520,2,&local_528,&local_530);
  cv::Size_<int>::Size_(&local_598,0x32,0x32);
  cv::Point_<int>::Point_(&local_5a0,-1,-1);
  cv::getStructuringElement(local_590,2,&local_598,&local_5a0);
  cv::_InputArray::_InputArray(&local_5b8,local_228);
  cv::_OutputArray::_OutputArray(&local_5d0,local_2e8);
  cv::_InputArray::_InputArray(&local_5e8,local_590);
  cv::Point_<int>::Point_(&local_5f0,-1,-1);
  cv::morphologyDefaultBorderValue();
  cv::dilate(&local_5b8,&local_5d0,&local_5e8,&local_5f0,1,0,local_610);
  cv::_InputArray::~_InputArray(&local_5e8);
  cv::_OutputArray::~_OutputArray(&local_5d0);
  cv::_InputArray::~_InputArray(&local_5b8);
  cv::_InputArray::_InputArray(&local_628,local_2e8);
  cv::_OutputArray::_OutputArray(&local_640,local_2e8);
  cv::_InputArray::_InputArray(&local_658,local_590);
  cv::Point_<int>::Point_(&local_660,-1,-1);
  cv::morphologyDefaultBorderValue();
  cv::dilate(&local_628,&local_640,&local_658,&local_660,1,0,local_680);
  cv::_InputArray::~_InputArray(&local_658);
  cv::_OutputArray::~_OutputArray(&local_640);
  cv::_InputArray::~_InputArray(&local_628);
  cv::_InputArray::_InputArray(&local_698,local_2e8);
  cv::_OutputArray::_OutputArray(&local_6b0,local_2e8);
  cv::_InputArray::_InputArray(&local_6c8,local_520);
  cv::Point_<int>::Point_(&local_6d0,-1,-1);
  cv::morphologyDefaultBorderValue();
  cv::dilate(&local_698,&local_6b0,&local_6c8,&local_6d0,1,0,local_6f0);
  cv::_InputArray::~_InputArray(&local_6c8);
  cv::_OutputArray::~_OutputArray(&local_6b0);
  cv::_InputArray::~_InputArray(&local_698);
  cv::_InputArray::_InputArray(&local_708,local_2e8);
  cv::_OutputArray::_OutputArray(&local_720,local_2e8);
  cv::_InputArray::_InputArray(&local_738,local_520);
  cv::Point_<int>::Point_(&local_740,-1,-1);
  cv::morphologyDefaultBorderValue();
  cv::dilate(&local_708,&local_720,&local_738,&local_740,1,0,local_760);
  cv::_InputArray::~_InputArray(&local_738);
  cv::_OutputArray::~_OutputArray(&local_720);
  cv::_InputArray::~_InputArray(&local_708);
  cv::_InputArray::_InputArray(&local_778,local_2e8);
  cv::_OutputArray::_OutputArray(&local_790,local_288);
  cv::_InputArray::_InputArray(&local_7a8,local_590);
  cv::Point_<int>::Point_(&local_7b0,-1,-1);
  cv::morphologyDefaultBorderValue();
  cv::erode(&local_778,&local_790,&local_7a8,&local_7b0,1,0,local_7d0);
  cv::_InputArray::~_InputArray(&local_7a8);
  cv::_OutputArray::~_OutputArray(&local_790);
  cv::_InputArray::~_InputArray(&local_778);
  cv::_InputArray::_InputArray(&local_7e8,local_288);
  cv::_OutputArray::_OutputArray(&local_800,local_288);
  cv::_InputArray::_InputArray(&local_818,local_590);
  cv::Point_<int>::Point_(&local_820,-1,-1);
  cv::morphologyDefaultBorderValue();
  cv::erode(&local_7e8,&local_800,&local_818,&local_820,1,0,local_840);
  cv::_InputArray::~_InputArray(&local_818);
  cv::_OutputArray::~_OutputArray(&local_800);
  cv::_InputArray::~_InputArray(&local_7e8);
  cv::_InputArray::_InputArray(&local_858,local_288);
  cv::_OutputArray::_OutputArray(&local_870,local_288);
  cv::_InputArray::_InputArray(&local_888,local_590);
  cv::Point_<int>::Point_(&local_890,-1,-1);
  cv::morphologyDefaultBorderValue();
  cv::erode(&local_858,&local_870,&local_888,&local_890,1,0,local_8b0);
  cv::_InputArray::~_InputArray(&local_888);
  cv::_OutputArray::~_OutputArray(&local_870);
  cv::_InputArray::~_InputArray(&local_858);
  cv::_InputArray::_InputArray(&local_8c8,local_288);
  cv::_OutputArray::_OutputArray(&local_8e0,local_288);
  cv::_InputArray::_InputArray(&local_8f8,local_590);
  cv::Point_<int>::Point_(&local_900,-1,-1);
  cv::morphologyDefaultBorderValue();
  cv::erode(&local_8c8,&local_8e0,&local_8f8,&local_900,1,0,local_920);
  cv::_InputArray::~_InputArray(&local_8f8);
  cv::_OutputArray::~_OutputArray(&local_8e0);
  cv::_InputArray::~_InputArray(&local_8c8);
  cv::_InputArray::_InputArray(&local_938,local_288);
  cv::_OutputArray::_OutputArray(&local_950,local_288);
  cv::_InputArray::_InputArray(&local_968,local_520);
  cv::Point_<int>::Point_(&local_970,-1,-1);
  cv::morphologyDefaultBorderValue();
  cv::erode(&local_938,&local_950,&local_968,&local_970,1,0,local_990);
  cv::_InputArray::~_InputArray(&local_968);
  cv::_OutputArray::~_OutputArray(&local_950);
  cv::_InputArray::~_InputArray(&local_938);
  cv::_InputArray::_InputArray(&local_9a8,local_288);
  cv::_OutputArray::_OutputArray(&local_9c0,local_288);
  cv::_InputArray::_InputArray(&local_9d8,local_520);
  cv::Point_<int>::Point_(&local_9e0,-1,-1);
  cv::morphologyDefaultBorderValue();
  cv::erode(&local_9a8,&local_9c0,&local_9d8,&local_9e0,1,0,local_a00);
  cv::_InputArray::~_InputArray(&local_9d8);
  cv::_OutputArray::~_OutputArray(&local_9c0);
  cv::_InputArray::~_InputArray(&local_9a8);
  cv::_InputArray::_InputArray(&local_a18,local_2e8);
  cv::_InputArray::_InputArray(&local_a30,local_288);
  cv::_OutputArray::_OutputArray(&local_a48,local_348);
  cv::addWeighted(&local_a18,0.5,&local_a30,0.5,0.0,&local_a48,-1);
  cv::_OutputArray::~_OutputArray(&local_a48);
  cv::_InputArray::~_InputArray(&local_a30);
  cv::_InputArray::~_InputArray(&local_a18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a68,"result/lady_trimap1.jpg",&local_a69)
  ;
  cv::_InputArray::_InputArray(&local_a88,local_348);
  sm.data = (uchar *)0x0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&sm.data);
  cv::imwrite(local_a68,&local_a88,(vector *)&sm.data);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&sm.data);
  cv::_InputArray::~_InputArray(&local_a88);
  std::__cxx11::string::~string(local_a68);
  std::allocator<char>::~allocator(&local_a69);
  this = std::operator<<((ostream *)&std::cout,"ok");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  SharedMatting::SharedMatting((SharedMatting *)&alpha);
  SharedMatting::loadImage((SharedMatting *)&alpha,"input/lady1.jpg");
  SharedMatting::loadTrimap((SharedMatting *)&alpha,"result/lady_trimap1.jpg");
  SharedMatting::solveAlpha((SharedMatting *)&alpha);
  SharedMatting::save((SharedMatting *)&alpha,"result/lady_alpha1.jpg");
  ppiVar2 = SharedMatting::alpha_return((SharedMatting *)&alpha);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_cd8,"background/background.jpg",&local_cd9);
  cv::imread(local_cb8,(int)local_cd8);
  std::__cxx11::string::~string(local_cd8);
  std::allocator<char>::~allocator(&local_cd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d60,"result/lady_alpha1.jpg",&local_d61);
  cv::imread(local_d40,(int)local_d60);
  std::__cxx11::string::~string(local_d60);
  std::allocator<char>::~allocator(&local_d61);
  cv::_InputArray::_InputArray(&local_d80,(Mat *)local_d40);
  cv::_OutputArray::_OutputArray(&local_d98,(Mat *)local_d40);
  cv::Size_<int>::Size_(&local_da0,10,10);
  cv::Point_<int>::Point_(&local_da8,-1,-1);
  cv::boxFilter(&local_d80,&local_d98,0xffffffff,&local_da0,&local_da8,1,4);
  cv::_OutputArray::~_OutputArray(&local_d98);
  cv::_InputArray::~_InputArray(&local_d80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_dc8,"result/lady_alpha1.jpg",&local_dc9);
  cv::_InputArray::_InputArray(&local_de8,(Mat *)local_d40);
  _src_col = (pointer)0x0;
  piStack_e00 = (pointer)0x0;
  local_df8 = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&src_col);
  cv::imwrite(local_dc8,&local_de8,(vector *)&src_col);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&src_col);
  cv::_InputArray::~_InputArray(&local_de8);
  std::__cxx11::string::~string(local_dc8);
  std::allocator<char>::~allocator(&local_dc9);
  i = _src;
  j = local_64;
  for (local_e14 = 0; local_e14 < i; local_e14 = local_e14 + 1) {
    for (local_e18 = 0; local_e18 < j; local_e18 = local_e18 + 1) {
      this_00 = cv::Mat::at<cv::Vec<unsigned_char,3>>((Mat *)local_d40,local_e14,local_e18);
      pbVar3 = cv::Vec<unsigned_char,_3>::operator[](this_00,0);
      ppiVar2[local_e14][local_e18] = (int)(double)*pbVar3;
    }
  }
  cv::_InputArray::_InputArray(&local_e30,(Mat *)local_cb8);
  cv::_OutputArray::_OutputArray(&local_e48,(Mat *)local_cb8);
  cv::MatSize::operator()((MatSize *)&data_s);
  cv::resize(0,&local_e30,&local_e48,&data_s,1);
  cv::_OutputArray::~_OutputArray(&local_e48);
  cv::_InputArray::~_InputArray(&local_e30);
  for (local_e14 = 0; local_e14 < i; local_e14 = local_e14 + 1) {
    data_b = cv::Mat::ptr<unsigned_char>((Mat *)local_70,local_e14);
    data_a = cv::Mat::ptr<unsigned_char>((Mat *)local_cb8,local_e14);
    local_e68 = cv::Mat::ptr<unsigned_char>((Mat *)local_d40,local_e14);
    for (local_e18 = 0; local_e18 < j; local_e18 = local_e18 + 1) {
      iVar1 = local_e18 * 3;
      data_b[iVar1] =
           (uchar)(int)((double)data_a[iVar1] *
                        (1.0 - (double)ppiVar2[local_e14][local_e18] / 255.0) +
                       ((double)data_b[iVar1] * (double)ppiVar2[local_e14][local_e18]) / 255.0);
      lVar4 = (long)(local_e18 * 3);
      data_b[lVar4 + 1] =
           (uchar)(int)((double)data_a[lVar4 + 1] *
                        (1.0 - (double)ppiVar2[local_e14][local_e18] / 255.0) +
                       ((double)data_b[lVar4 + 1] * (double)ppiVar2[local_e14][local_e18]) / 255.0);
      data_b[local_e18 * 3 + 2] =
           (uchar)(int)((double)data_a[(long)(local_e18 * 3) + 2] *
                        (1.0 - (double)ppiVar2[local_e14][local_e18] / 255.0) +
                       ((double)data_b[(long)(local_e18 * 3) + 2] *
                       (double)ppiVar2[local_e14][local_e18]) / 255.0);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e88,"result/lady_result1.jpg",&local_e89)
  ;
  cv::_InputArray::_InputArray(&local_ea8,(Mat *)local_70);
  local_ec8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_ec8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_ec8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&local_ec8);
  cv::imwrite(local_e88,&local_ea8,(vector *)&local_ec8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_ec8);
  cv::_InputArray::~_InputArray(&local_ea8);
  std::__cxx11::string::~string(local_e88);
  std::allocator<char>::~allocator(&local_e89);
  cv::_InputArray::_InputArray(&local_ee0,(Mat *)local_70);
  cv::_OutputArray::_OutputArray(&local_ef8,(Mat *)local_70);
  cv::MatSize::operator()(local_f00);
  cv::resize(0,&local_ee0,&local_ef8,local_f00,1);
  cv::_OutputArray::~_OutputArray(&local_ef8);
  cv::_InputArray::~_InputArray(&local_ee0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f20,"result",&local_f21);
  cv::_InputArray::_InputArray(&local_f40,(Mat *)local_70);
  cv::imshow(local_f20,&local_f40);
  cv::_InputArray::~_InputArray(&local_f40);
  std::__cxx11::string::~string(local_f20);
  std::allocator<char>::~allocator(&local_f21);
  cv::waitKey(0);
  cv::Mat::~Mat((Mat *)local_d40);
  cv::Mat::~Mat((Mat *)local_cb8);
  SharedMatting::~SharedMatting((SharedMatting *)&alpha);
  cv::Mat::~Mat(local_590);
  cv::Mat::~Mat(local_520);
  cv::Mat::~Mat(local_348);
  cv::Mat::~Mat(local_2e8);
  cv::Mat::~Mat(local_288);
  cv::Mat::~Mat(local_228);
  cv::Mat::~Mat(local_1c8);
  cv::Mat::~Mat(local_168);
  cv::Mat::~Mat(local_108);
  cv::Mat::~Mat((Mat *)local_70);
  return 0;
}

Assistant:

int main()
{
	Mat src = imread("input/lady1.jpg");
	Mat out, can1,can2, can, ero, dil,trimap;
	boxFilter(src, out, -1, Size(10, 10));
	Canny(out, can1, 36, 36, 3);
       
	Rect ccomp;
	floodFill(out, Point(10, 10), Scalar(0, 0, 0), &ccomp, Scalar(3, 3, 3), Scalar(3, 3, 3));
	Canny(out, can2, 15, 15, 3);
	addWeighted(can1, 1.0, can2, 1.0, 0.0, can);

	/*floodFill(out, Point(10, 10), Scalar(0, 0, 0), &ccomp, Scalar(3, 3, 3), Scalar(3, 3, 3));
	floodFill(out, Point(1963, 2400), Scalar(0, 0, 0), &ccomp, Scalar(3, 3, 3), Scalar(3, 3, 3));*/
    Mat element = getStructuringElement(MORPH_ELLIPSE, Size(35, 35));
	Mat element_e = getStructuringElement(MORPH_ELLIPSE, Size(50, 50));
	dilate(can, dil, element_e);
	dilate(dil, dil, element_e);
	dilate(dil, dil, element);
	dilate(dil, dil, element);
	erode(dil, ero, element_e);
	erode(ero, ero, element_e);
	erode(ero, ero, element_e);
	erode(ero, ero, element_e);
	erode(ero, ero, element);
    erode(ero, ero, element);
	//cvtColor(out, g_grayImage, CV_RGB2GRAY);
	//threshold(g_grayImage, g_dstImage, g_nThresholdValue, 255, g_nThresholdType);
	addWeighted(dil,0.5,ero,0.5,0.0,trimap);
	//imwrite("dil.jpg", dil);
	//imwrite("ero.jpg", ero);
	imwrite("result/lady_trimap1.jpg", trimap);
	cout << "ok" << endl; 

        SharedMatting sm;
        sm.loadImage("input/lady1.jpg");
        sm.loadTrimap("result/lady_trimap1.jpg");
        sm.solveAlpha();
        sm.save("result/lady_alpha1.jpg");
        int ** alpha = sm.alpha_return();
        Mat b_k = imread("background/background.jpg");
        Mat alp = imread("result/lady_alpha1.jpg");
        boxFilter(alp, alp, -1, Size(10, 10));
        imwrite("result/lady_alpha1.jpg", alp);
        int src_row = src.rows;
        int src_col = src.cols;
        int i,j;
       for (i=0; i<src_row ;i++) 
        {
          
           for (j=0; j<src_col; j++)
           {
              alpha[i][j] = double (alp.at<Vec3b>(i,j)[0]); 
           }
        }
    
        resize(b_k, b_k, src.size());

        for (i=0; i<src_row ;i++) 
        {
           uchar* data_s = src.ptr<uchar>(i);
           uchar* data_b = b_k.ptr<uchar>(i);
           uchar* data_a = alp.ptr<uchar>(i);
           for (j=0; j<src_col; j++)
           {
              data_s[3*j] = uchar(double(data_s[3*j]) * double(alpha[i][j])/255.0 + double(data_b[3*j]) * (1.0 - double(alpha[i][j])/255.0)); 
             data_s[3*j+1] = uchar(double(data_s[3*j+1]) * double(alpha[i][j])/255.0 + double(data_b[3*j+1]) * (1.0 - double(alpha[i][j])/255.0)); 
             data_s[3*j+2] = uchar(double(data_s[3*j+2]) * double(alpha[i][j])/255.0 + double(data_b[3*j+2]) * (1.0 - double(alpha[i][j])/255.0)); 
           }
        }
        imwrite("result/lady_result1.jpg", src);
        resize(src, src, src.size());
        imshow("result",src);
        waitKey(0);
    return 0;
}